

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meanfield_cpu.cpp
# Opt level: O1

void __thiscall
MeanField::CPU::CRF::runInference(CRF *this,uchar *image,float *unaries,int iterations)

{
  int iVar1;
  
  (*(this->super_CRF)._vptr_CRF[7])();
  if (1 < iterations) {
    iVar1 = iterations + -1;
    do {
      (*(this->super_CRF)._vptr_CRF[7])
                (this,image,
                 (this->QDistribution)._M_t.
                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                 super__Head_base<0UL,_float_*,_false>._M_head_impl);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void CRF::runInference(const unsigned char *image, const float *unaries, int iterations) {
    runInferenceIteration(image, unaries);
    for (int i = 0; i < iterations - 1; i++) {
        runInferenceIteration(image, QDistribution.get());
    }
}